

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

void aes_ecb_encrypt(aes_context *ctx,uint8_t *input,uint8_t *output)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint32_t *puVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  
  uVar1 = get32be(input);
  uVar12 = uVar1 ^ ctx->key[0];
  uVar1 = get32be(input + 4);
  uVar10 = uVar1 ^ ctx->key[1];
  uVar1 = get32be(input + 8);
  uVar11 = uVar1 ^ ctx->key[2];
  uVar1 = get32be(input + 0xc);
  uVar2 = uVar1 ^ ctx->key[3];
  iVar4 = ctx->nr >> 1;
  lVar7 = (long)(iVar4 + -1);
  puVar5 = ctx->key + 0xb;
  while (bVar13 = lVar7 != 0, lVar7 = lVar7 + -1, bVar13) {
    uVar3 = *(uint *)((long)TE + (ulong)(uVar10 >> 0xe & 0x3fc));
    uVar8 = (TE[uVar2 & 0xff] << 8 | TE[uVar2 & 0xff] >> 0x18) ^
            (TE[uVar11 >> 8 & 0xff] << 0x10 | TE[uVar11 >> 8 & 0xff] >> 0x10) ^
            (uVar3 << 0x18 | uVar3 >> 8) ^ TE[uVar12 >> 0x18] ^ puVar5[-7];
    uVar3 = *(uint *)((long)TE + (ulong)(uVar11 >> 0xe & 0x3fc));
    uVar9 = (TE[uVar12 & 0xff] << 8 | TE[uVar12 & 0xff] >> 0x18) ^
            (TE[uVar2 >> 8 & 0xff] << 0x10 | TE[uVar2 >> 8 & 0xff] >> 0x10) ^
            (uVar3 << 0x18 | uVar3 >> 8) ^ TE[uVar10 >> 0x18] ^ puVar5[-6];
    uVar3 = *(uint *)((long)TE + (ulong)(uVar2 >> 0xe & 0x3fc));
    uVar6 = (TE[uVar10 & 0xff] << 8 | TE[uVar10 & 0xff] >> 0x18) ^
            (TE[uVar12 >> 8 & 0xff] << 0x10 | TE[uVar12 >> 8 & 0xff] >> 0x10) ^
            (uVar3 << 0x18 | uVar3 >> 8) ^ TE[uVar11 >> 0x18] ^ puVar5[-5];
    uVar12 = *(uint *)((long)TE + (ulong)(uVar12 >> 0xe & 0x3fc));
    uVar3 = (TE[uVar11 & 0xff] << 8 | TE[uVar11 & 0xff] >> 0x18) ^
            (TE[uVar10 >> 8 & 0xff] << 0x10 | TE[uVar10 >> 8 & 0xff] >> 0x10) ^
            (uVar12 << 0x18 | uVar12 >> 8) ^ TE[uVar2 >> 0x18] ^ puVar5[-4];
    uVar2 = *(uint *)((long)TE + (ulong)(uVar9 >> 0xe & 0x3fc));
    uVar12 = (TE[uVar3 & 0xff] << 8 | TE[uVar3 & 0xff] >> 0x18) ^
             (TE[uVar6 >> 8 & 0xff] << 0x10 | TE[uVar6 >> 8 & 0xff] >> 0x10) ^
             (uVar2 << 0x18 | uVar2 >> 8) ^ TE[uVar8 >> 0x18] ^ puVar5[-3];
    uVar2 = *(uint *)((long)TE + (ulong)(uVar6 >> 0xe & 0x3fc));
    uVar10 = (TE[uVar8 & 0xff] << 8 | TE[uVar8 & 0xff] >> 0x18) ^
             (TE[uVar3 >> 8 & 0xff] << 0x10 | TE[uVar3 >> 8 & 0xff] >> 0x10) ^
             (uVar2 << 0x18 | uVar2 >> 8) ^ TE[uVar9 >> 0x18] ^ puVar5[-2];
    uVar2 = *(uint *)((long)TE + (ulong)(uVar3 >> 0xe & 0x3fc));
    uVar11 = (TE[uVar9 & 0xff] << 8 | TE[uVar9 & 0xff] >> 0x18) ^
             (TE[uVar8 >> 8 & 0xff] << 0x10 | TE[uVar8 >> 8 & 0xff] >> 0x10) ^
             (uVar2 << 0x18 | uVar2 >> 8) ^ TE[uVar6 >> 0x18] ^ puVar5[-1];
    uVar2 = *(uint *)((long)TE + (ulong)(uVar8 >> 0xe & 0x3fc));
    uVar2 = (TE[uVar6 & 0xff] << 8 | TE[uVar6 & 0xff] >> 0x18) ^
            (TE[uVar9 >> 8 & 0xff] << 0x10 | TE[uVar9 >> 8 & 0xff] >> 0x10) ^
            (uVar2 << 0x18 | uVar2 >> 8) ^ TE[uVar3 >> 0x18] ^ *puVar5;
    puVar5 = puVar5 + 8;
  }
  uVar3 = *(uint *)((long)TE + (ulong)(uVar10 >> 0xe & 0x3fc));
  uVar6 = (TE[uVar2 & 0xff] << 8 | TE[uVar2 & 0xff] >> 0x18) ^
          (TE[uVar11 >> 8 & 0xff] << 0x10 | TE[uVar11 >> 8 & 0xff] >> 0x10) ^
          (uVar3 << 0x18 | uVar3 >> 8) ^ TE[uVar12 >> 0x18] ^ ctx->key[(long)iVar4 * 8 + -4];
  uVar3 = *(uint *)((long)TE + (ulong)(uVar11 >> 0xe & 0x3fc));
  uVar8 = (TE[uVar12 & 0xff] << 8 | TE[uVar12 & 0xff] >> 0x18) ^
          (TE[uVar2 >> 8 & 0xff] << 0x10 | TE[uVar2 >> 8 & 0xff] >> 0x10) ^
          (uVar3 << 0x18 | uVar3 >> 8) ^ TE[uVar10 >> 0x18] ^ puVar5[-6];
  uVar3 = *(uint *)((long)TE + (ulong)(uVar2 >> 0xe & 0x3fc));
  uVar3 = (TE[uVar10 & 0xff] << 8 | TE[uVar10 & 0xff] >> 0x18) ^
          (TE[uVar12 >> 8 & 0xff] << 0x10 | TE[uVar12 >> 8 & 0xff] >> 0x10) ^
          (uVar3 << 0x18 | uVar3 >> 8) ^ TE[uVar11 >> 0x18] ^ puVar5[-5];
  uVar12 = *(uint *)((long)TE + (ulong)(uVar12 >> 0xe & 0x3fc));
  uVar2 = (TE[uVar11 & 0xff] << 8 | TE[uVar11 & 0xff] >> 0x18) ^
          (TE[uVar10 >> 8 & 0xff] << 0x10 | TE[uVar10 >> 8 & 0xff] >> 0x10) ^
          (uVar12 << 0x18 | uVar12 >> 8) ^ TE[uVar2 >> 0x18] ^ puVar5[-4];
  uVar10 = ((uint)Te[uVar2 & 0xff] |
           (uint)Te[uVar3 >> 8 & 0xff] << 8 |
           (uint)Te[uVar8 >> 0x10 & 0xff] << 0x10 | (uint)Te[uVar6 >> 0x18] << 0x18) ^ puVar5[-3];
  uVar12 = ((uint)Te[uVar6 & 0xff] |
           (uint)Te[uVar2 >> 8 & 0xff] << 8 |
           (uint)Te[uVar3 >> 0x10 & 0xff] << 0x10 | (uint)Te[uVar8 >> 0x18] << 0x18) ^ puVar5[-2];
  uVar11 = ((uint)Te[uVar8 & 0xff] |
           (uint)Te[uVar6 >> 8 & 0xff] << 8 |
           (uint)Te[uVar2 >> 0x10 & 0xff] << 0x10 | (uint)Te[uVar3 >> 0x18] << 0x18) ^ puVar5[-1];
  uVar2 = ((uint)Te[uVar3 & 0xff] |
          (uint)Te[uVar8 >> 8 & 0xff] << 8 |
          (uint)Te[uVar6 >> 0x10 & 0xff] << 0x10 | (uint)Te[uVar2 >> 0x18] << 0x18) ^ *puVar5;
  *output = (uint8_t)(uVar10 >> 0x18);
  output[1] = (uint8_t)(uVar10 >> 0x10);
  output[2] = (uint8_t)(uVar10 >> 8);
  output[3] = (uint8_t)uVar10;
  output[4] = (uint8_t)(uVar12 >> 0x18);
  output[5] = (uint8_t)(uVar12 >> 0x10);
  output[6] = (uint8_t)(uVar12 >> 8);
  output[7] = (uint8_t)uVar12;
  output[8] = (uint8_t)(uVar11 >> 0x18);
  output[9] = (uint8_t)(uVar11 >> 0x10);
  output[10] = (uint8_t)(uVar11 >> 8);
  output[0xb] = (uint8_t)uVar11;
  output[0xc] = (uint8_t)(uVar2 >> 0x18);
  output[0xd] = (uint8_t)(uVar2 >> 0x10);
  output[0xe] = (uint8_t)(uVar2 >> 8);
  output[0xf] = (uint8_t)uVar2;
  return;
}

Assistant:

void aes_ecb_encrypt(const aes_context* ctx, const uint8_t* input, uint8_t* output)
{
#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_ecb_encrypt_x86(ctx, input, output);
        return;
    }
#endif
    aes_encrypt(ctx, input, output);
}